

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

bool __thiscall create::Create::updateLEDs(Create *this)

{
  element_type *this_00;
  ssize_t sVar1;
  size_t __n;
  int in_R8D;
  undefined1 local_15;
  char local_14;
  uint8_t local_13;
  uint8_t local_12;
  char local_11;
  uint8_t cmd [4];
  Create *pCStack_10;
  uint8_t LEDByte;
  Create *this_local;
  
  __n = (size_t)this->checkLED;
  local_14 = this->debrisLED + this->spotLED + this->dockLED + this->checkLED;
  local_15 = 0x8b;
  local_13 = this->powerLED;
  local_12 = this->powerLEDIntensity;
  local_11 = local_14;
  pCStack_10 = this;
  this_00 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->serial);
  sVar1 = Serial::send(this_00,(int)&local_15,(void *)0x4,__n,in_R8D);
  return (bool)((byte)sVar1 & 1);
}

Assistant:

bool Create::updateLEDs() {
    uint8_t LEDByte = debrisLED + spotLED + dockLED + checkLED;
    uint8_t cmd[4] = { OC_LEDS,
                       LEDByte,
                       powerLED,
                       powerLEDIntensity
                     };

    return serial->send(cmd, 4);
  }